

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snprintf_support.c
# Opt level: O2

int snprintf_s_i(char *dest,rsize_t dmax,char *format,int a)

{
  uint uVar1;
  int iVar2;
  char pformatList [16];
  
  uVar1 = parse_format(format,pformatList,0x10);
  if (uVar1 == 1) {
    if (((byte)pformatList[0] - 99 < 6) && ((0x23U >> ((byte)pformatList[0] - 99 & 0x1f) & 1) != 0))
    {
      iVar2 = __snprintf_chk(dest,dmax,1,0xffffffffffffffff,format,a);
      return iVar2;
    }
    *dest = '\0';
    iVar2 = -0x19b;
  }
  else {
    *dest = '\0';
    iVar2 = -0x19a;
  }
  return iVar2;
}

Assistant:

inline int snprintf_s_i(char *dest, rsize_t dmax, const char *format, int a)
{
	char pformatList[MAX_FORMAT_ELEMENTS];
	unsigned int index = 0;

	// Determine the number of format options in the format string
	unsigned int  nfo = parse_format(format, &pformatList[0], MAX_FORMAT_ELEMENTS);

	// Check that there are not too many format options
	if ( nfo != 1 ) {
		dest[0] = '\0';
		return SNPRFNEGATE(ESBADFMT);
	}
	// Check that the format is for an integer type
	if ( check_integer_format(pformatList[index]) == 0) {
		dest[0] = '\0';
		return SNPRFNEGATE(ESFMTTYP);
	}
	index++;

	return snprintf(dest, dmax, format, a);
}